

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NtpReply.h
# Opt level: O2

qint64 __thiscall NtpReply::localClockOffset(NtpReply *this)

{
  long lVar1;
  long lVar2;
  NtpTimestamp local_30;
  QDateTime local_28 [8];
  NtpTimestamp local_20;
  NtpTimestamp local_18;
  
  NtpTimestamp::toDateTime(&local_18,&(this->m_packet).basic.originateTimestamp);
  NtpTimestamp::toDateTime(&local_20,&(this->m_packet).basic.receiveTimestamp);
  lVar1 = QDateTime::msecsTo((QDateTime *)&local_18);
  QDateTime::QDateTime(local_28,&this->m_destinationTime);
  NtpTimestamp::toDateTime(&local_30,&(this->m_packet).basic.transmitTimestamp);
  lVar2 = QDateTime::msecsTo(local_28);
  QDateTime::~QDateTime((QDateTime *)&local_30);
  QDateTime::~QDateTime(local_28);
  QDateTime::~QDateTime((QDateTime *)&local_20);
  QDateTime::~QDateTime((QDateTime *)&local_18);
  return (lVar2 + lVar1) / 2;
}

Assistant:

qint64 localClockOffset() const {
        return (originTime().msecsTo(receiveTime()) + destinationTime().msecsTo(transmitTime())) / 2;
    }